

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

bool sptk::SnPrintf<sptk::uint24_t>
               (uint24_t *data,string *print_format,size_t buffer_size,char *buffer)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  bVar4 = false;
  if (((buffer != (char *)0x0) && (buffer_size != 0)) && (print_format->_M_string_length != 0)) {
    uVar3 = (uint)data->value[1] << 8 | (uint)data->value[2] << 0x10;
    uVar2 = (ulong)(data->value[0] | uVar3);
    iVar1 = snprintf(buffer,buffer_size,(print_format->_M_dataplus)._M_p,uVar2,uVar2,(ulong)uVar3,0)
    ;
    bVar4 = -1 < iVar1;
  }
  return bVar4;
}

Assistant:

bool SnPrintf(uint24_t data, const std::string& print_format,
              std::size_t buffer_size, char* buffer) {
  if (print_format.empty() || 0 == buffer_size || NULL == buffer) {
    return false;
  }

  return (std::snprintf(buffer, buffer_size, print_format.c_str(),
                        static_cast<int>(data)) < 0)
             ? false
             : true;
}